

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_thread.c
# Opt level: O0

void ares_event_process_updates(ares_event_thread_t *e)

{
  ares_bool_t aVar1;
  ares_llist_node_t *node_00;
  ares_event_t *ptr;
  ares_event_t *local_28;
  ares_event_t *oldev;
  ares_event_t *newev;
  ares_llist_node_t *node;
  ares_event_thread_t *e_local;
  
  while (node_00 = ares_llist_node_first(e->ev_updates), node_00 != (ares_llist_node_t *)0x0) {
    ptr = (ares_event_t *)ares_llist_node_claim(node_00);
    if (ptr->fd == -1) {
      local_28 = (ares_event_t *)ares_htable_vpvp_get_direct(e->ev_cust_handles,ptr->data);
    }
    else {
      local_28 = (ares_event_t *)ares_htable_asvp_get_direct(e->ev_sock_handles,ptr->fd);
    }
    if (local_28 == (ares_event_t *)0x0) {
      ptr->e = e;
      if ((ptr->flags == ARES_EVENT_FLAG_NONE) ||
         (aVar1 = (*e->ev_sys->event_add)(ptr), aVar1 == ARES_FALSE)) {
        ptr->e = (ares_event_thread_t *)0x0;
        ares_event_destroy_cb(ptr);
      }
      else if (ptr->fd == -1) {
        ares_htable_vpvp_insert(e->ev_cust_handles,ptr->data,ptr);
      }
      else {
        ares_htable_asvp_insert(e->ev_sock_handles,ptr->fd,ptr);
      }
    }
    else if (ptr->flags == ARES_EVENT_FLAG_NONE) {
      if (ptr->fd == -1) {
        ares_htable_vpvp_remove(e->ev_cust_handles,ptr->data);
      }
      else {
        ares_htable_asvp_remove(e->ev_sock_handles,ptr->fd);
      }
      ares_free(ptr);
    }
    else {
      (*e->ev_sys->event_mod)(local_28,ptr->flags);
      local_28->flags = ptr->flags;
      ares_free(ptr);
    }
  }
  return;
}

Assistant:

static void ares_event_process_updates(ares_event_thread_t *e)
{
  ares_llist_node_t *node;

  /* Iterate across all updates and apply to internal list, removing from update
   * list */
  while ((node = ares_llist_node_first(e->ev_updates)) != NULL) {
    ares_event_t *newev = ares_llist_node_claim(node);
    ares_event_t *oldev;

    if (newev->fd == ARES_SOCKET_BAD) {
      oldev = ares_htable_vpvp_get_direct(e->ev_cust_handles, newev->data);
    } else {
      oldev = ares_htable_asvp_get_direct(e->ev_sock_handles, newev->fd);
    }

    /* Adding new */
    if (oldev == NULL) {
      newev->e = e;
      /* Don't try to add a new event if all flags are cleared, that's basically
       * someone trying to delete something already deleted.  Also if it fails
       * to add, cleanup. */
      if (newev->flags == ARES_EVENT_FLAG_NONE ||
          !e->ev_sys->event_add(newev)) {
        newev->e = NULL;
        ares_event_destroy_cb(newev);
      } else {
        if (newev->fd == ARES_SOCKET_BAD) {
          ares_htable_vpvp_insert(e->ev_cust_handles, newev->data, newev);
        } else {
          ares_htable_asvp_insert(e->ev_sock_handles, newev->fd, newev);
        }
      }
      continue;
    }

    /* Removal request */
    if (newev->flags == ARES_EVENT_FLAG_NONE) {
      /* the callback for the removal will call e->ev_sys->event_del(e, event)
       */
      if (newev->fd == ARES_SOCKET_BAD) {
        ares_htable_vpvp_remove(e->ev_cust_handles, newev->data);
      } else {
        ares_htable_asvp_remove(e->ev_sock_handles, newev->fd);
      }
      ares_free(newev);
      continue;
    }

    /* Modify request -- only flags can be changed */
    e->ev_sys->event_mod(oldev, newev->flags);
    oldev->flags = newev->flags;
    ares_free(newev);
  }
}